

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

bool __thiscall FIX::Message::setStringHeader(Message *this,string *string)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int local_98;
  undefined1 local_88 [8];
  FieldBase field;
  ulong uStack_28;
  int count;
  size_type pos;
  string *string_local;
  Message *this_local;
  
  pos = (size_type)string;
  string_local = (string *)this;
  clear(this);
  uStack_28 = 0;
  field.m_metrics.m_checksum = 0;
  do {
    uVar2 = uStack_28;
    uVar5 = std::__cxx11::string::size();
    if (uVar5 <= uVar2) goto LAB_00266871;
    extractField((FieldBase *)local_88,this,(string *)pos,&stack0xffffffffffffffd8,
                 (DataDictionary *)0x0,(DataDictionary *)0x0,(Group *)0x0);
    if (field.m_metrics.m_checksum < 3) {
      lVar6 = (long)field.m_metrics.m_checksum;
      field.m_metrics.m_checksum = field.m_metrics.m_checksum + 1;
      iVar1 = *(int *)(headerOrder + lVar6 * 4);
      iVar4 = FieldBase::getTag((FieldBase *)local_88);
      if (iVar1 == iVar4) goto LAB_002667f3;
      this_local._7_1_ = 0;
      local_98 = 1;
    }
    else {
LAB_002667f3:
      bVar3 = isHeaderField((FieldBase *)local_88,(DataDictionary *)0x0);
      if (bVar3) {
        FieldMap::appendField(&(this->m_header).super_FieldMap,(FieldBase *)local_88);
        local_98 = 0;
      }
      else {
        local_98 = 3;
      }
    }
    FieldBase::~FieldBase((FieldBase *)local_88);
  } while (local_98 == 0);
  if (local_98 != 1) {
LAB_00266871:
    FieldMap::sortFields(&(this->m_header).super_FieldMap);
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Message::setStringHeader(const std::string &string) {
  clear();

  std::string::size_type pos = 0;
  int count = 0;

  while (pos < string.size()) {
    FieldBase field = extractField(string, pos);
    if (count < 3 && headerOrder[count++] != field.getTag()) {
      return false;
    }

    if (isHeaderField(field)) {
      m_header.appendField(field);
    } else {
      break;
    }
  }

  m_header.sortFields();
  return true;
}